

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_pbe.c
# Opt level: O0

void gga_x_pbe_init(xc_func_type *p)

{
  void *pvVar1;
  long in_RDI;
  
  pvVar1 = malloc(0x20);
  *(void **)(in_RDI + 0x178) = pvVar1;
  return;
}

Assistant:

static void
gga_x_pbe_init(xc_func_type *p)
{
  gga_x_pbe_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_pbe_params));
  params = (gga_x_pbe_params *) (p->params);

  /* This has to be explicitly initialized here */
  params->lambda = 0.0;
}